

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase493::run(TestCase493 *this)

{
  TupleElement<1U,_kj::Promise<kj::String>_> *__stat_loc;
  TupleElement<2U,_kj::Promise<int>_> *this_00;
  char *pcVar1;
  size_t sVar2;
  PromiseNode *pPVar3;
  __pid_t _Var4;
  TransformPromiseNodeBase *this_01;
  char *ptrCopy;
  bool bVar5;
  WaitScope waitScope;
  Tuple<Promise<int>,_Promise<String>,_Promise<int>_> split;
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> promise;
  EventLoop loop;
  String local_c8;
  EventLoop *local_b0;
  undefined4 local_a8;
  SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> local_a0;
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> local_70;
  __pid_t local_5c;
  EventLoop local_58;
  
  EventLoop::EventLoop(&local_58);
  local_a8 = 0xffffffff;
  local_b0 = &local_58;
  EventLoop::enterScope(&local_58);
  _::yield();
  this_01 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_01,(Own<kj::_::PromiseNode> *)&local_a0,
             _::
             TransformPromiseNode<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:497:65),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar3 = local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr;
  (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00435860;
  local_70.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<int,kj::String,kj::Promise<int>>,kj::_::Void,kj::(anonymous_namespace)::TestCase493::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_70.super_PromiseBase.node.ptr = (PromiseNode *)this_01;
  if (local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr !=
      (PromiseNode *)0x0) {
    local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr =
         (PromiseNode *)0x0;
    (**(local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.
       disposer)->_vptr_Disposer)
              (local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.
               disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_>::split(&local_a0,&local_70);
  _Var4 = Promise<int>::wait((Promise<int> *)&local_a0,&local_b0);
  if ((_Var4 != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_c8.content.ptr = (char *)CONCAT44(local_c8.content.ptr._4_4_,0x7b);
    local_5c = Promise<int>::wait((Promise<int> *)&local_a0,&local_b0);
    _::Debug::log<char_const(&)[58],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1f7,ERROR,
               "\"failed: expected \" \"(123) == (get<0>(split).wait(waitScope))\", 123, get<0>(split).wait(waitScope)"
               ,(char (*) [58])"failed: expected (123) == (get<0>(split).wait(waitScope))",
               (int *)&local_c8,&local_5c);
  }
  __stat_loc = &local_a0.impl.super_TupleElement<1U,_kj::Promise<kj::String>_>;
  Promise<kj::String>::wait((Promise<kj::String> *)&local_c8,__stat_loc);
  sVar2 = local_c8.content.size_;
  pcVar1 = local_c8.content.ptr;
  bVar5 = true;
  if (local_c8.content.size_ == 4) {
    bVar5 = (char)*(short *)((long)local_c8.content.ptr + 2) != 'o' ||
            *(short *)local_c8.content.ptr != 0x6f66;
  }
  if ((short *)local_c8.content.ptr != (short *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar5 & _::Debug::minSeverity < 3)) {
    Promise<kj::String>::wait((Promise<kj::String> *)&local_c8,__stat_loc);
    _::Debug::log<char_const(&)[60],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1f8,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (get<1>(split).wait(waitScope))\", \"foo\", get<1>(split).wait(waitScope)"
               ,(char (*) [60])"failed: expected (\"foo\") == (get<1>(split).wait(waitScope))",
               (char (*) [4])0x38b288,&local_c8);
    sVar2 = local_c8.content.size_;
    pcVar1 = local_c8.content.ptr;
    if ((short *)local_c8.content.ptr != (short *)0x0) {
      local_c8.content.ptr = (char *)0x0;
      local_c8.content.size_ = 0;
      (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
                (local_c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  this_00 = &local_a0.impl.super_TupleElement<2U,_kj::Promise<int>_>;
  _Var4 = Promise<int>::wait(&this_00->value,&local_b0);
  if ((_Var4 != 0x141) && (_::Debug::minSeverity < 3)) {
    local_c8.content.ptr = (char *)CONCAT44(local_c8.content.ptr._4_4_,0x141);
    local_5c = Promise<int>::wait(&this_00->value,&local_b0);
    _::Debug::log<char_const(&)[58],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1f9,ERROR,
               "\"failed: expected \" \"(321) == (get<2>(split).wait(waitScope))\", 321, get<2>(split).wait(waitScope)"
               ,(char (*) [58])"failed: expected (321) == (get<2>(split).wait(waitScope))",
               (int *)&local_c8,&local_5c);
  }
  pPVar3 = local_a0.impl.super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr;
  if (local_a0.impl.super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr !=
      (PromiseNode *)0x0) {
    local_a0.impl.super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr =
         (PromiseNode *)0x0;
    (**(local_a0.impl.super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.node.
       disposer)->_vptr_Disposer)
              (local_a0.impl.super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.node.
               disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  pPVar3 = local_a0.impl.super_TupleElement<1U,_kj::Promise<kj::String>_>.value.super_PromiseBase.
           node.ptr;
  if (local_a0.impl.super_TupleElement<1U,_kj::Promise<kj::String>_>.value.super_PromiseBase.node.
      ptr != (PromiseNode *)0x0) {
    local_a0.impl.super_TupleElement<1U,_kj::Promise<kj::String>_>.value.super_PromiseBase.node.ptr
         = (PromiseNode *)0x0;
    (**(local_a0.impl.super_TupleElement<1U,_kj::Promise<kj::String>_>.value.super_PromiseBase.node.
       disposer)->_vptr_Disposer)
              (local_a0.impl.super_TupleElement<1U,_kj::Promise<kj::String>_>.value.
               super_PromiseBase.node.disposer,
               pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  pPVar3 = local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr;
  if (local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr !=
      (PromiseNode *)0x0) {
    local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr =
         (PromiseNode *)0x0;
    (**(local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.
       disposer)->_vptr_Disposer)
              (local_a0.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.
               disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  pPVar3 = local_70.super_PromiseBase.node.ptr;
  if ((TransformPromiseNodeBase *)local_70.super_PromiseBase.node.ptr !=
      (TransformPromiseNodeBase *)0x0) {
    local_70.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_70.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_70.super_PromiseBase.node.disposer,
               ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_b0);
  EventLoop::~EventLoop(&local_58);
  return;
}

Assistant:

TEST(Async, Split) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Tuple<int, String, Promise<int>>> promise = evalLater([&]() {
    return kj::tuple(123, str("foo"), Promise<int>(321));
  });

  Tuple<Promise<int>, Promise<String>, Promise<int>> split = promise.split();

  EXPECT_EQ(123, get<0>(split).wait(waitScope));
  EXPECT_EQ("foo", get<1>(split).wait(waitScope));
  EXPECT_EQ(321, get<2>(split).wait(waitScope));
}